

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_rla_absy_sets_c_without_pagecrossing_Test::TestBody
          (CpuAbsoluteIndexedTest_rla_absy_sets_c_without_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_rla_absy_sets_c_without_pagecrossing_Test *this_local;
  
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.a = '{';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.a = '\n';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.field_0x114 = 0x87;
  CpuAbsoluteIndexedTest::run_readwrite_instruction_without_pagecrossing
            (&this->super_CpuAbsoluteIndexedTest,';',Y,'\x0e');
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, rla_absy_sets_c_without_pagecrossing) {
    registers.p = Z_FLAG;
    registers.a = 0b01111011;
    expected.a = 0b00001010;
    expected.p = C_FLAG;
    memory_content = 0b10000111;
    run_readwrite_instruction_without_pagecrossing(
            RLA_ABSY, IndexReg::Y, 0b00001110);
}